

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * __thiscall
FSerializer::Sprite(FSerializer *this,char *key,int32_t *spritenum,int32_t *def)

{
  DWORD DVar1;
  FWriter *this_00;
  bool bVar2;
  Value *this_01;
  Ch *cc;
  DWORD *pDVar3;
  spritedef_t *psVar4;
  uint uVar5;
  DWORD local_40;
  DWORD hint;
  uint32_t name;
  Value *val;
  int32_t *def_local;
  int32_t *spritenum_local;
  char *key_local;
  FSerializer *this_local;
  
  bVar2 = isWriting(this);
  if (bVar2) {
    bVar2 = FWriter::inObject(this->w);
    if (((!bVar2) || (def == (int32_t *)0x0)) || (*def != *spritenum)) {
      WriteKey(this,key);
      this_00 = this->w;
      psVar4 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)*spritenum);
      FWriter::String(this_00,(char *)psVar4,4);
    }
  }
  else {
    this_01 = FReader::FindKey(this->r,key);
    if ((this_01 != (Value *)0x0) &&
       (bVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsString(this_01), bVar2)) {
      cc = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_01);
      pDVar3 = (DWORD *)UnicodeToString(cc);
      DVar1 = *pDVar3;
      local_40 = NumStdSprites;
      do {
        uVar5 = local_40 - 1;
        if (local_40 == 0) {
          return this;
        }
        psVar4 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(ulong)uVar5);
        local_40 = uVar5;
      } while ((psVar4->field_0).dwName != DVar1);
      *spritenum = uVar5;
    }
  }
  return this;
}

Assistant:

FSerializer &FSerializer::Sprite(const char *key, int32_t &spritenum, int32_t *def)
{
	if (isWriting())
	{
		if (w->inObject() && def != nullptr && *def == spritenum) return *this;
		WriteKey(key);
		w->String(sprites[spritenum].name, 4);
	}
	else
	{
		auto val = r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsString())
			{
				uint32_t name = *reinterpret_cast<const uint32_t*>(UnicodeToString(val->GetString()));
				for (auto hint = NumStdSprites; hint-- != 0; )
				{
					if (sprites[hint].dwName == name)
					{
						spritenum = hint;
						break;
					}
				}
			}
		}
	}
	return *this;
}